

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricTracerCreateExpPrologue
          (ZETParameterValidation *this,zet_context_handle_t hContext,zet_device_handle_t hDevice,
          uint32_t metricGroupCount,zet_metric_group_handle_t *phMetricGroups,
          zet_metric_tracer_exp_desc_t *desc,ze_event_handle_t hNotificationEvent,
          zet_metric_tracer_exp_handle_t *phMetricTracer)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (hDevice != (zet_device_handle_t)0x0 && hContext != (zet_context_handle_t)0x0) {
    zVar1 = ZE_RESULT_SUCCESS;
    if (phMetricTracer == (zet_metric_tracer_exp_handle_t *)0x0) {
      zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (desc == (zet_metric_tracer_exp_desc_t *)0x0) {
      zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (phMetricGroups == (zet_metric_group_handle_t *)0x0) {
      zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricTracerCreateExpPrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t* phMetricGroups,      ///< [in][range(0, metricGroupCount )] handles of the metric groups to
                                                        ///< trace
        zet_metric_tracer_exp_desc_t* desc,             ///< [in,out] metric tracer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification. Note:
                                                        ///< If buffer is not drained when the event it flagged, there is a risk of
                                                        ///< HW event buffer being overrun
        zet_metric_tracer_exp_handle_t* phMetricTracer  ///< [out] handle of the metric tracer
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phMetricGroups )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phMetricTracer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ParameterValidation::validateExtensions(desc);
    }